

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

int tcdmain(int argc,char **argv,char *save_ext)

{
  int iVar1;
  uint uVar2;
  osfildef *fp;
  tcderrdef errcbcx;
  errdef fr_;
  errcxdef errctx;
  char vsnbuf [128];
  tcderrdef local_468;
  errdef local_438;
  errcxdef local_300;
  char local_b8 [136];
  
  local_468.tcderrfil = (FILE *)0x0;
  local_468.tcderrtok = (tokcxdef *)0x0;
  local_468.tcderrlvl = 0;
  local_468.tcderrcnt = 0;
  local_468.tcdwrncnt = 0;
  local_468.tcdfatal = 0;
  local_468.tcdwrn_AMBIGBIN = '\x01';
  local_468._33_7_ = 0;
  local_300.errcxlog = tcdlogerr;
  local_300.errcxlgc = (void *)0x0;
  local_300.errcxofs = 0;
  local_300.errcxfp = (osfildef *)0x0;
  local_300.errcxappctx = (appctxdef *)0x0;
  fp = oserrop(*argv);
  errini(&local_300,fp);
  sprintf(local_b8,"%s v%s.%s.%s  %s\n",tcgname,vsn_major,vsn_minor,vsn_maint,
          "Copyright (c) 1993, 2012 Michael J. Roberts");
  tcdptf(local_b8);
  sprintf(local_b8,"TADS for %s [%s] patchlevel %s.%s\n","POSIX/Unix/MS-Windows",
          "POSIX_UNIX_MSWINDOWS","1","0");
  tcdptf(local_b8);
  tcdptf("%s maintains this port.\n","Nikos Chantziaras <realnc@gmail.com>");
  iVar1 = _setjmp((__jmp_buf_tag *)local_438.errbuf);
  local_438.errcode = iVar1;
  if (iVar1 == 0) {
    local_438.errprv = local_300.errcxptr;
    local_300.errcxptr = &local_438;
    tcdmain1(&local_300,argc,argv,&local_468,save_ext);
    local_300.errcxptr = local_438.errprv;
  }
  else {
    local_300.errcxptr = local_438.errprv;
    if (iVar1 != 0x5dc) {
      (*local_300.errcxlog)
                (local_300.errcxlgc,local_438.errfac,iVar1,local_438.erraac,local_438.erraav);
    }
    if ((FILE *)local_300.errcxfp != (FILE *)0x0) {
      fclose((FILE *)local_300.errcxfp);
    }
    if ((FILE *)local_468.tcderrfil != (FILE *)0x0) {
      fclose((FILE *)local_468.tcderrfil);
    }
    maybe_pause();
  }
  uVar2 = 1;
  if (iVar1 == 0) {
    if ((FILE *)local_300.errcxfp != (FILE *)0x0) {
      fclose((FILE *)local_300.errcxfp);
    }
    if ((FILE *)local_468.tcderrfil != (FILE *)0x0) {
      fclose((FILE *)local_468.tcderrfil);
    }
    maybe_pause();
    uVar2 = (uint)(local_468.tcderrcnt != 0);
  }
  return uVar2;
}

Assistant:

int tcdmain(int argc, char **argv, char *save_ext)
{
    errcxdef   errctx;
    int        err;
    osfildef  *fp;
    extern     char tcgname[];
    tcderrdef  errcbcx;                           /* error callback context */
    char       vsnbuf[128];

    /* initialize the error structure */
    CLRSTRUCT(errcbcx);
    errcbcx.tcdwrn_AMBIGBIN = TRUE;                   /* -v+abin by default */

    errctx.errcxlog = tcdlogerr;
    errctx.errcxlgc = (void *)0;
    errctx.errcxofs = 0;
    errctx.errcxfp  = (osfildef *)0;
    errctx.errcxappctx = 0;
    fp = oserrop(argv[0]);
    errini(&errctx, fp);

    /* copyright-date-string */
    sprintf(vsnbuf, "%s v%s.%s.%s  %s\n", tcgname,
            vsn_major, vsn_minor, vsn_maint,
            "Copyright (c) 1993, 2012 Michael J. Roberts");
    tcdptf(vsnbuf);
    sprintf(vsnbuf, "TADS for %s [%s] patchlevel %s.%s\n",
            OS_SYSTEM_LDESC, OS_SYSTEM_NAME,
            TADS_OEM_VERSION, OS_SYSTEM_PATCHSUBLVL);
    tcdptf(vsnbuf);
    tcdptf("%s maintains this port.\n", TADS_OEM_NAME);
    
    ERRBEGIN(&errctx)
        tcdmain1(&errctx, argc, argv, &errcbcx, save_ext);
    ERRCATCH(&errctx, err)
        if (err != ERR_USAGE)
            errclog(&errctx);
    
        if (errctx.errcxfp) osfcls(errctx.errcxfp);
        if (errcbcx.tcderrfil) fclose(errcbcx.tcderrfil);
        /* os_expause(); */
        maybe_pause();
        return(OSEXFAIL);
    ERREND(&errctx)

    /* close message file */
    if (errctx.errcxfp) osfcls(errctx.errcxfp);

    /* close error echo file if any */
    if (errcbcx.tcderrfil) fclose(errcbcx.tcderrfil);

    /* os_expause(); */
    maybe_pause();
    return(errcbcx.tcderrcnt == 0 ? OSEXSUCC : OSEXFAIL);
}